

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O0

bool __thiscall BlockFilterIndex::CustomAppend(BlockFilterIndex *this,BlockInfo *block)

{
  undefined8 uVar1;
  CBlock *in_RSI;
  BlockFilter *in_RDI;
  long in_FS_OFFSET;
  bool res;
  uint256 *header;
  CBlockIndex *pindex;
  CBlockUndo block_undo;
  BlockFilter filter;
  BlockFilter *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  CBlockIndex *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  char *in_stack_ffffffffffffff10;
  undefined8 *puVar2;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  CBlockIndex *in_stack_ffffffffffffff28;
  BlockFilter *pBVar3;
  BlockFilterType filter_type;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  byte bVar4;
  CBlockIndex *in_stack_ffffffffffffff58;
  CBlockUndo *in_stack_ffffffffffffff60;
  BlockManager *in_stack_ffffffffffffff68;
  undefined8 local_90 [17];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pBVar3 = in_RDI;
  CBlockUndo::CBlockUndo((CBlockUndo *)in_stack_fffffffffffffed8);
  filter_type = (BlockFilterType)((ulong)pBVar3 >> 0x38);
  if (0 < *(int *)((in_RSI->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                  + 0xc)) {
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffed8);
    in_stack_fffffffffffffef8 =
         CustomAppend::anon_class_16_2_f791057a::operator()
                   ((anon_class_16_2_f791057a *)
                    CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    in_stack_ffffffffffffff28 = in_stack_fffffffffffffef8;
    in_stack_fffffffffffffef7 =
         ::node::BlockManager::UndoReadFromDisk
                   (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (!(bool)in_stack_fffffffffffffef7) {
      bVar4 = 0;
      goto LAB_00923b97;
    }
  }
  inline_assertion_check<true,CBlock_const*const&>
            ((CBlock **)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,(char *)in_RDI,
             (char *)in_stack_fffffffffffffef8);
  BlockFilter::BlockFilter
            ((BlockFilter *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             filter_type,in_RSI,(CBlockUndo *)in_stack_ffffffffffffff28);
  BlockFilter::ComputeHeader
            ((BlockFilter *)in_stack_fffffffffffffef8,
             (uint256 *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  puVar2 = local_90;
  bVar4 = Write((BlockFilterIndex *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                in_RDI,(uint32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                (uint256 *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  if ((bool)bVar4) {
    in_RDI[2].m_filter.m_encoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*puVar2;
    uVar1 = puVar2[1];
    in_RDI[3].m_filter_type = (char)uVar1;
    in_RDI[3].m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = (char)((ulong)uVar1 >> 8);
    in_RDI[3].m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = (char)((ulong)uVar1 >> 0x10);
    in_RDI[3].m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = (char)((ulong)uVar1 >> 0x18);
    in_RDI[3].m_block_hash.super_base_blob<256U>.m_data._M_elems[3] = (char)((ulong)uVar1 >> 0x20);
    in_RDI[3].m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = (char)((ulong)uVar1 >> 0x28);
    in_RDI[3].m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = (char)((ulong)uVar1 >> 0x30);
    in_RDI[3].m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = (char)((ulong)uVar1 >> 0x38);
    *(undefined8 *)(in_RDI[3].m_block_hash.super_base_blob<256U>.m_data._M_elems + 7) = puVar2[2];
    *(undefined8 *)(in_RDI[3].m_block_hash.super_base_blob<256U>.m_data._M_elems + 0xf) = puVar2[3];
  }
  BlockFilter::~BlockFilter(in_stack_fffffffffffffed8);
LAB_00923b97:
  CBlockUndo::~CBlockUndo((CBlockUndo *)in_stack_fffffffffffffed8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool BlockFilterIndex::CustomAppend(const interfaces::BlockInfo& block)
{
    CBlockUndo block_undo;

    if (block.height > 0) {
        // pindex variable gives indexing code access to node internals. It
        // will be removed in upcoming commit
        const CBlockIndex* pindex = WITH_LOCK(cs_main, return m_chainstate->m_blockman.LookupBlockIndex(block.hash));
        if (!m_chainstate->m_blockman.UndoReadFromDisk(block_undo, *pindex)) {
            return false;
        }
    }

    BlockFilter filter(m_filter_type, *Assert(block.data), block_undo);

    const uint256& header = filter.ComputeHeader(m_last_header);
    bool res = Write(filter, block.height, header);
    if (res) m_last_header = header; // update last header
    return res;
}